

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,StringTree *params_4,ArrayPtr<const_char> *params_5,
          String *params_6,ArrayPtr<const_char> *params_7,ArrayPtr<const_char> *params_8,
          ArrayPtr<const_char> *params_9,StringTree *params_10,ArrayPtr<const_char> *params_11)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t result;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  size_t result_2;
  String local_b8;
  size_t local_98;
  char *local_90;
  size_t sStack_88;
  size_t local_80;
  char *local_78;
  char *local_70;
  size_t local_68;
  size_t local_60;
  size_t sStack_58;
  size_t local_50;
  char *local_48;
  char *local_40;
  ArrayPtr<const_char> *local_38;
  
  sVar3 = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_98 = this->size_;
  local_90 = (params->text).content.ptr;
  sStack_88 = params_1->size_;
  local_80 = params_2->size_;
  local_78 = params_3->ptr;
  local_70 = (params_4->text).content.ptr;
  local_68 = params_5->size_ - 1;
  if (params_5->size_ == 0) {
    local_68 = sVar3;
  }
  local_60 = (params_6->content).size_;
  sStack_58 = params_7->size_;
  local_50 = params_8->size_;
  local_48 = params_9->ptr;
  local_40 = (params_10->text).content.ptr;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_98 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x60);
  __return_storage_ptr__->size_ = sVar3;
  sVar3 = 0;
  local_98 = 0;
  local_78 = (char *)0x0;
  local_68 = 0;
  local_48 = (char *)0x0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_98 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x60);
  local_38 = params_2;
  heapString(&local_b8,sVar3);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_b8.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_b8.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_b8.content.disposer;
  local_98 = 1;
  local_90 = (char *)0x0;
  sStack_88 = 0;
  sVar3 = 0;
  local_80 = 0;
  local_78 = (char *)0x1;
  local_70 = (char *)0x0;
  local_68 = 1;
  local_60 = 0;
  sStack_58 = 0;
  local_50 = 0;
  local_48 = (char *)0x1;
  local_40 = (char *)0x0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_98 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x60);
  local_b8.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                          destruct);
  local_b8.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_b8.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_b8.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_b8.content.size_;
  (__return_storage_ptr__->branches).disposer = local_b8.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar5,0,this,(ArrayPtr<const_char> *)params,params_1,local_38,
             (StringTree *)params_3,(ArrayPtr<const_char> *)params_4,(String *)params_5,
             (ArrayPtr<const_char> *)params_6,params_7,params_8,(StringTree *)params_9,
             (ArrayPtr<const_char> *)params_10);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}